

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_rkv.c
# Opt level: O3

MPP_RET hal_vp9d_rkv_deinit(void *hal)

{
  long lVar1;
  MppBuffer pvVar2;
  MPP_RET MVar3;
  char *fmt;
  long lVar4;
  
  lVar1 = *(long *)((long)hal + 0x40);
  if (*(int *)((long)hal + 0x38) == 0) {
    if ((*(MppBuffer *)(lVar1 + 0xc0) == (MppBuffer)0x0) ||
       (MVar3 = mpp_buffer_put_with_caller(*(MppBuffer *)(lVar1 + 0xc0),"hal_vp9d_release_res"),
       MVar3 == MPP_OK)) {
      if ((*(MppBuffer *)(lVar1 + 200) == (MppBuffer)0x0) ||
         (MVar3 = mpp_buffer_put_with_caller(*(MppBuffer *)(lVar1 + 200),"hal_vp9d_release_res"),
         MVar3 == MPP_OK)) {
        if ((*(MppBuffer *)(lVar1 + 0xd0) == (MppBuffer)0x0) ||
           (MVar3 = mpp_buffer_put_with_caller(*(MppBuffer *)(lVar1 + 0xd0),"hal_vp9d_release_res"),
           MVar3 == MPP_OK)) {
          if ((*(MppBuffer *)(lVar1 + 0xd8) == (MppBuffer)0x0) ||
             (MVar3 = mpp_buffer_put_with_caller
                                (*(MppBuffer *)(lVar1 + 0xd8),"hal_vp9d_release_res"),
             MVar3 == MPP_OK)) {
            if (*(void **)(lVar1 + 0xe0) != (void *)0x0) {
              mpp_osal_free("hal_vp9d_release_res",*(void **)(lVar1 + 0xe0));
              *(undefined8 *)(lVar1 + 0xe0) = 0;
            }
            goto LAB_00201c82;
          }
LAB_00201c66:
          fmt = "vp9 segid_last_base put buffer failed\n";
        }
        else {
LAB_00201c26:
          fmt = "vp9 segid_cur_base put buffer failed\n";
        }
      }
      else {
LAB_00201bfa:
        fmt = "vp9 count_base put buffer failed\n";
      }
    }
    else {
      fmt = "vp9 probe_base get buffer failed\n";
    }
LAB_00201c74:
    _mpp_log_l(2,"hal_vp9d_rkv",fmt,(char *)0x0);
  }
  else {
    lVar4 = 0x30;
    do {
      pvVar2 = *(MppBuffer *)(lVar1 + -0x20 + lVar4);
      if ((pvVar2 != (MppBuffer)0x0) &&
         (MVar3 = mpp_buffer_put_with_caller(pvVar2,"hal_vp9d_release_res"), MVar3 != MPP_OK)) {
        fmt = "vp9 probe_base put buffer failed\n";
        goto LAB_00201c74;
      }
      pvVar2 = *(MppBuffer *)(lVar1 + -0x18 + lVar4);
      if ((pvVar2 != (MppBuffer)0x0) &&
         (MVar3 = mpp_buffer_put_with_caller(pvVar2,"hal_vp9d_release_res"), MVar3 != MPP_OK))
      goto LAB_00201bfa;
      pvVar2 = *(MppBuffer *)(lVar1 + -0x10 + lVar4);
      if ((pvVar2 != (MppBuffer)0x0) &&
         (MVar3 = mpp_buffer_put_with_caller(pvVar2,"hal_vp9d_release_res"), MVar3 != MPP_OK))
      goto LAB_00201c26;
      pvVar2 = *(MppBuffer *)(lVar1 + -8 + lVar4);
      if ((pvVar2 != (MppBuffer)0x0) &&
         (MVar3 = mpp_buffer_put_with_caller(pvVar2,"hal_vp9d_release_res"), MVar3 != MPP_OK))
      goto LAB_00201c66;
      if (*(void **)(lVar1 + lVar4) != (void *)0x0) {
        mpp_osal_free("hal_vp9d_release_res",*(void **)(lVar1 + lVar4));
        *(undefined8 *)(lVar1 + lVar4) = 0;
      }
      lVar4 = lVar4 + 0x40;
    } while (lVar4 != 0xf0);
  }
LAB_00201c82:
  if ((*(MppBufferGroup *)((long)hal + 0x28) == (MppBufferGroup)0x0) ||
     (MVar3 = mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x28)), MVar3 == MPP_OK)) {
    if (*(void **)((long)hal + 0x40) != (void *)0x0) {
      mpp_osal_free("hal_vp9d_rkv_deinit",*(void **)((long)hal + 0x40));
    }
    *(undefined8 *)((long)hal + 0x40) = 0;
    MVar3 = MPP_OK;
  }
  else {
    _mpp_log_l(2,"hal_vp9d_rkv","vp9d group free buffer failed\n",(char *)0x0);
  }
  return MVar3;
}

Assistant:

MPP_RET hal_vp9d_rkv_deinit(void *hal)
{
    MPP_RET ret = MPP_OK;
    HalVp9dCtx *p_hal = (HalVp9dCtx *)hal;

    hal_vp9d_release_res(p_hal);

    if (p_hal->group) {
        ret = mpp_buffer_group_put(p_hal->group);
        if (ret) {
            mpp_err("vp9d group free buffer failed\n");
            return ret;
        }
    }
    MPP_FREE(p_hal->hw_ctx);
    return ret = MPP_OK;
}